

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_BloodSplatter2(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  byte *pbVar1;
  uint kind;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  DAngle local_50;
  DVector3 local_48;
  PClass *pPVar5;
  
  pPVar5 = (originator->super_DThinker).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar2 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
    (originator->super_DThinker).super_DObject.Class = pPVar5;
  }
  kind = *(uint *)&pPVar5[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.Conversions.Array;
  type = AActor::GetBloodType(originator,2);
  uVar7 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar7 = cl_bloodtype.Value & (*(int *)((type->super_PClass).Defaults + 0x1c8) << 4) >> 0x1f;
  }
  uVar3 = FRandom::GenRand32(&pr_splat);
  uVar4 = FRandom::GenRand32(&pr_splat);
  dVar8 = (double)(int)((uVar3 & 0xff) - 0x80) * 0.03125;
  dVar9 = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
  if (type != (PClassActor *)0x0) {
    local_48.Z = pos->Z;
    local_48.X = pos->X + dVar8;
    local_48.Y = pos->Y + dVar9;
    pAVar6 = AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
    (pAVar6->target).field_0.p = originator;
    if ((kind != 0) && (((pAVar6->flags2).Value & 0x10000) == 0)) {
      pAVar6->Translation = kind >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar7) {
      pbVar1 = (byte *)((long)&(pAVar6->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_004299f7;
    }
  }
  if ((int)uVar7 < 1) {
    return;
  }
LAB_004299f7:
  local_48.Z = pos->Z;
  local_48.X = dVar8 + pos->X;
  local_48.Y = dVar9 + pos->Y;
  local_50.Degrees = hitangle->Degrees + -180.0;
  P_DrawSplash2(0x28,&local_48,&local_50,2,kind);
  return;
}

Assistant:

void P_BloodSplatter2 (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(2);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	DVector2 add;
	add.X = (pr_splat() - 128) / 32.;
	add.Y = (pr_splat() - 128) / 32.;

	if (bloodcls != NULL)
	{
		AActor *mo;


		mo = Spawn (bloodcls, pos + add, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;

		// colorize the blood!
		if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(40, pos + add, hitangle - 180., 2, bloodcolor);
	}
}